

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void __thiscall
ParseContext::ParseContext
          (ParseContext *this,Allocator *allocator,int optimizationLevel,
          ArrayView<InplaceStr> activeImports)

{
  InplaceStr *val;
  uint i;
  uint index;
  ulong uVar1;
  ArrayView<InplaceStr> local_40;
  
  local_40.data = activeImports.data;
  local_40.count = activeImports.count;
  uVar1 = activeImports._8_8_ & 0xffffffff;
  Lexer::Lexer(&this->lexer,allocator);
  SmallArray<SynBinaryOpElement,_32U>::SmallArray(&this->binaryOpStack,allocator);
  (this->namespaceList).allocator = allocator;
  (this->namespaceList).data = (this->namespaceList).little;
  (this->namespaceList).count = 0;
  (this->namespaceList).max = 0x20;
  this->optimizationLevel = optimizationLevel;
  (this->activeImports).little[0].begin = (char *)0x0;
  (this->activeImports).little[0].end = (char *)0x0;
  (this->activeImports).little[1].begin = (char *)0x0;
  (this->activeImports).little[1].end = (char *)0x0;
  (this->activeImports).little[2].begin = (char *)0x0;
  (this->activeImports).little[2].end = (char *)0x0;
  (this->activeImports).little[3].begin = (char *)0x0;
  (this->activeImports).little[3].end = (char *)0x0;
  (this->activeImports).little[4].begin = (char *)0x0;
  (this->activeImports).little[4].end = (char *)0x0;
  (this->activeImports).little[5].begin = (char *)0x0;
  (this->activeImports).little[5].end = (char *)0x0;
  (this->activeImports).little[6].begin = (char *)0x0;
  (this->activeImports).little[6].end = (char *)0x0;
  (this->activeImports).little[7].begin = (char *)0x0;
  (this->activeImports).little[7].end = (char *)0x0;
  (this->activeImports).allocator = allocator;
  (this->activeImports).data = (this->activeImports).little;
  (this->activeImports).count = 0;
  (this->activeImports).max = 8;
  (this->errorInfo).allocator = allocator;
  (this->errorInfo).data = (this->errorInfo).little;
  (this->errorInfo).max = 4;
  (this->errorInfo).count = 0;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::SmallDenseMap
            (&this->nonTypeLocations,allocator);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::SmallDenseMap
            (&this->nonFunctionDefinitionLocations,allocator);
  this->allocator = allocator;
  this->expressionGroupDepth = 0;
  this->expressionBlockDepth = 0;
  this->statementBlockDepth = 0;
  this->errorHandlerActive = false;
  this->errorPos = (char *)0x0;
  this->errorCount = 0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorBufLocation = (char *)0x0;
  this->currentNamespace = (SynNamespaceElement *)0x0;
  this->bytecodeBuilder =
       (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
        *)0x0;
  this->code = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->lastLexeme = (Lexeme *)0x0;
  this->firstLexeme = (Lexeme *)0x0;
  this->currentLexeme = (Lexeme *)0x0;
  for (index = 0; index < (uint)uVar1; index = index + 1) {
    val = ArrayView<InplaceStr>::operator[](&local_40,index);
    SmallArray<InplaceStr,_8U>::push_back(&this->activeImports,val);
    uVar1 = (ulong)local_40.count;
  }
  return;
}

Assistant:

ParseContext::ParseContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): lexer(allocator), binaryOpStack(allocator), namespaceList(allocator), optimizationLevel(optimizationLevel), activeImports(allocator), errorInfo(allocator), nonTypeLocations(allocator), nonFunctionDefinitionLocations(allocator), allocator(allocator)
{
	code = NULL;

	moduleRoot = NULL;

	bytecodeBuilder = NULL;

	firstLexeme = NULL;
	currentLexeme = NULL;
	lastLexeme = NULL;

	expressionGroupDepth = 0;
	expressionBlockDepth = 0;
	statementBlockDepth = 0;

	errorHandlerActive = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	currentNamespace = NULL;

	for(unsigned i = 0; i < activeImports.size(); i++)
		this->activeImports.push_back(activeImports[i]);
}